

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

VFSNode __thiscall VFS::CVFS::CVFSDir::Search(CVFSDir *this,string *Name)

{
  __type _Var1;
  size_t sVar2;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VFSNode VVar3;
  string local_50;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(Name + 2))->__data);
  (this->super_CVFSNode)._vptr_CVFSNode = (_func_int **)0x0;
  (this->super_CVFSNode).m_Name._M_dataplus._M_p = (pointer)0x0;
  if (Name[3]._M_string_length != Name[3].field_2._M_allocated_capacity) {
    sVar2 = Search((CVFSDir *)Name,in_RDX,0,
                   ((long)(Name[3].field_2._M_allocated_capacity - Name[3]._M_string_length) >> 4) -
                   1);
    CVFSNode::Name_abi_cxx11_(&local_50,*(CVFSNode **)(Name[3]._M_string_length + sVar2 * 0x10));
    _Var1 = std::operator==(&local_50,in_RDX);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      std::__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2> *)
                 (sVar2 * 0x10 + Name[3]._M_string_length));
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(Name + 2));
  VVar3.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar3.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_CVFSNode
  ;
  return (VFSNode)VVar3.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VFSNode Search(const std::string &Name)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        VFSNode Ret;

                        if(!m_Childs.empty())
                        {
                            size_t Pos = Search(Name, 0, m_Childs.size() - 1);
                            if(m_Childs[Pos]->Name() == Name)
                                Ret = m_Childs[Pos];
                        }

                        return Ret;
                    }